

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_try::translate
          (method_try *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  element_type *peVar2;
  _Elt_pointer ppsVar3;
  _Elt_pointer pdVar4;
  bool bVar5;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *p_Var6;
  iterator *piVar7;
  _Elt_pointer ppsVar8;
  int iVar9;
  _Elt_pointer ppsVar10;
  statement_try *this_00;
  _Elt_pointer pptVar11;
  compile_error *this_01;
  long lVar12;
  ulong uVar13;
  _Map_pointer pppsVar14;
  statement_base *size;
  long lVar15;
  deque<cs::statement_base*,std::allocator<cs::statement_base*>> *this_02;
  statement_base **ptr;
  statement_base *__args;
  statement_base *psVar16;
  string name;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> tbody;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> cbody;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  context_t local_288;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  context_t *local_258;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_250;
  string local_248;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_228;
  string local_208;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_1e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_198;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_148;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_f8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_a8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  local_148._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_148,0);
  peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_228._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_228._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_228._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_228._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar15 = (long)local_228._M_cur - (long)local_228._M_first;
  lVar12 = lVar15 >> 4;
  uVar1 = lVar12 * -0x3333333333333333 + 1;
  if (lVar15 < -0x9f) {
    uVar13 = ~((lVar12 * 0x3333333333333333 - 2U) / 6);
  }
  else {
    if (uVar1 < 6) {
      local_228._M_cur = local_228._M_cur + 1;
      goto LAB_0015e3f5;
    }
    uVar13 = uVar1 / 6;
  }
  local_228._M_node = local_228._M_node + uVar13;
  local_228._M_first = *local_228._M_node;
  local_228._M_last = local_228._M_first + 6;
  local_228._M_cur = local_228._M_first + uVar13 * -6 + uVar1;
LAB_0015e3f5:
  local_58._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&local_1e8,&local_228,&local_58,(allocator_type *)&local_198);
  translator_type::translate
            (&peVar2->translator,&peVar2->context,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)&local_1e8,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_148,false)
  ;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)&local_1e8);
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_1e8,0);
  local_198._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_map_size = 0;
  size = (statement_base *)0x0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_198,0);
  ppsVar8 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_258 = context;
  local_250 = raw;
  if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_148._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    bVar5 = false;
    pppsVar14 = local_148._M_impl.super__Deque_impl_data._M_start._M_node;
    __args = (statement_base *)local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar16 = (statement_base *)local_148._M_impl.super__Deque_impl_data._M_start._M_last;
    do {
      iVar9 = (*((statement_base *)__args->_vptr_statement_base)->_vptr_statement_base[2])();
      if (iVar9 == 0x1b) {
        size = (statement_base *)__args->_vptr_statement_base + 1;
        bVar5 = true;
        std::__cxx11::string::_M_assign((string *)&local_278);
      }
      else {
        if (bVar5) {
          this_02 = (deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_198;
          p_Var6 = &local_198;
          ppsVar10 = local_198._M_impl.super__Deque_impl_data._M_finish._M_cur;
          ppsVar3 = local_198._M_impl.super__Deque_impl_data._M_finish._M_last;
        }
        else {
          this_02 = (deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_1e8;
          p_Var6 = &local_1e8;
          ppsVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          ppsVar3 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
        }
        piVar7 = &(p_Var6->_M_impl).super__Deque_impl_data._M_finish;
        if (ppsVar10 == ppsVar3 + -1) {
          size = __args;
          std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
          _M_push_back_aux<cs::statement_base*const&>(this_02,(statement_base **)__args);
        }
        else {
          *ppsVar10 = (statement_base *)__args->_vptr_statement_base;
          piVar7->_M_cur = piVar7->_M_cur + 1;
        }
      }
      __args = (statement_base *)&__args->context;
      if (__args == psVar16) {
        __args = (statement_base *)pppsVar14[1];
        pppsVar14 = pppsVar14 + 1;
        psVar16 = __args + 0x10;
      }
    } while (__args != (statement_base *)ppsVar8);
    if (bVar5) {
      this_00 = (statement_try *)statement_base::operator_new((statement_base *)0xe0,(size_t)size);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,local_278,local_278 + local_270);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_a8,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1e8);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_198);
      local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_258->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (local_258->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
      if (local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pdVar4 = (local_250->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar11 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar11 ==
          (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar11 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_try::statement_try
                (this_00,&local_248,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_a8,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8,
                 &local_288,pptVar11[-1]);
      if (local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_f8);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_198);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_1e8);
      if (local_278 != &local_268) {
        operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_148);
      return &this_00->super_statement_base;
    }
  }
  this_01 = (compile_error *)__cxa_allocate_exception(0x28);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"Wrong grammar for try statement, expect catch statement.","");
  compile_error::compile_error(this_01,&local_208);
  __cxa_throw(this_01,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *method_try::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		std::string name;
		std::deque<statement_base *> tbody, cbody;
		bool founded = false;
		for (auto &ptr: body) {
			if (ptr->get_type() == statement_types::catch_) {
				name = static_cast<statement_catch *>(ptr)->get_name();
				founded = true;
				continue;
			}
			if (founded)
				cbody.push_back(ptr);
			else
				tbody.push_back(ptr);
		}
		if (!founded)
			throw compile_error("Wrong grammar for try statement, expect catch statement.");
		return new statement_try(name, tbody, cbody, context, raw.front().back());
	}